

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O0

void __thiscall
LeavesAtDifferentLevels_ForwardIteration_Test::~LeavesAtDifferentLevels_ForwardIteration_Test
          (LeavesAtDifferentLevels_ForwardIteration_Test *this)

{
  LeavesAtDifferentLevels_ForwardIteration_Test *this_local;
  
  ~LeavesAtDifferentLevels_ForwardIteration_Test(this);
  operator_delete(this,0x160);
  return;
}

Assistant:

TEST_F (LeavesAtDifferentLevels, ForwardIteration) {
    transaction_type t1 = begin (db_, lock_guard{mutex_});
    // With a known hash function and the insertion order below, we should end up with a
    // trie which looks like:
    //
    //          +--------+--------+--------+
    // root_ -> | 000000 | 000001 | 000010 |   (hash bits 0-5)
    //          +--------+--------+--------+
    //              |        |        |
    //              v        |        |
    //             "a"       |        v       (0b000000'000000)
    //                       |       "d"      (0b000000'000010)
    //                       v
    //              +--------+--------+
    //              | 000000 | 000001 |       (hash bits 6-11)
    //              +--------+--------+
    //                  |        |
    //                  v        |
    //                 "b"       v            (0b000000'000001)
    //                          "c"           (0b000001'000001)
    this->insert_or_assign (*index_, t1, "a");
    this->insert_or_assign (*index_, t1, "b");
    this->insert_or_assign (*index_, t1, "c");
    this->insert_or_assign (*index_, t1, "d");

    test_trie::iterator begin = index_->begin (db_);
    test_trie::iterator end = index_->end (db_);
    EXPECT_NE (begin, end);

    std::string const & v1 = (*begin).first;
    EXPECT_EQ ("a", v1);
    ++begin;
    std::string const & v2 = (*begin).first;
    EXPECT_EQ ("b", v2);
    ++begin;
    std::string const & v3 = (*begin).first;
    EXPECT_EQ ("c", v3);
    ++begin;
    std::string const & v4 = (*begin).first;
    EXPECT_EQ ("d", v4);
    ++begin;
    EXPECT_EQ (begin, end);

    index_->flush (t1, db_.get_current_revision ());
    this->check_is_store_internal_node (index_->root ());

    // Check trie iterator in the store.
    test_trie::const_iterator cbegin = index_->cbegin (db_);
    test_trie::const_iterator cend = index_->cend (db_);
    EXPECT_NE (cbegin, cend);

    std::string const v5 = cbegin->first;
    EXPECT_EQ ("a", v5);
    ++cbegin;
    std::string const v6 = cbegin->first;
    EXPECT_EQ ("b", v6);
    ++cbegin;
    std::string const v7 = cbegin->first;
    EXPECT_EQ ("c", v7);
    ++cbegin;
    std::string const v8 = cbegin->first;
    EXPECT_EQ ("d", v8);
    ++cbegin;
    EXPECT_EQ (cbegin, cend);
}